

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder_optimum_normal.c
# Opt level: O3

void lzma_lzma_optimum_normal
               (lzma_lzma1_encoder *coder,lzma_mf *mf,uint32_t *back_res,uint32_t *len_res,
               uint32_t position)

{
  uint32_t *puVar1;
  lzma_lzma_state *plVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  short sVar6;
  ushort uVar7;
  ushort uVar8;
  uint8_t *puVar9;
  undefined8 uVar10;
  lzma_mf *plVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint uVar14;
  undefined4 extraout_var;
  short *psVar15;
  sbyte sVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  uint32_t *puVar20;
  lzma_lzma_state lVar21;
  uint uVar22;
  uint32_t price;
  int iVar23;
  ulong uVar24;
  uint32_t uVar25;
  uint uVar26;
  int iVar27;
  uint32_t *puVar28;
  uint uVar29;
  long lVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  undefined4 in_register_00000084;
  short *psVar34;
  long lVar35;
  ulong uVar36;
  uint uVar37;
  long lVar38;
  uint32_t model_index;
  lzma_lzma_state lVar39;
  uint uVar40;
  ulong uVar41;
  byte bVar42;
  uint uVar43;
  bool bVar44;
  int iVar50;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  int iVar51;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  int iVar58;
  undefined1 auVar57 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  uint32_t reps [4];
  uint32_t matches_count;
  ulong local_190;
  uint local_160;
  uint local_138 [3];
  uint32_t uStack_12c;
  uint32_t local_124;
  uint32_t *local_120;
  uint *local_118;
  ulong local_110;
  uint32_t (*local_108) [272];
  lzma_mf *local_100;
  uint32_t *local_f8;
  ulong local_f0;
  lzma_match *local_e8;
  uint local_dc;
  int local_d8;
  uint local_d4;
  probability (*local_d0) [16];
  uint32_t (*local_c8) [272];
  uint32_t *local_c0;
  probability (*local_b8) [16];
  undefined8 local_b0;
  ulong local_a8;
  uint32_t (*local_a0) [272];
  uint8_t *local_98;
  uint local_8c;
  uint32_t local_88;
  uint local_84;
  ulong local_80;
  ulong local_78;
  uint32_t *local_70;
  uint32_t *local_68;
  undefined8 local_60;
  probability *local_58;
  long local_50;
  ulong local_48;
  uint32_t (*local_40) [128];
  uint32_t (*local_38) [64];
  
  local_b0 = CONCAT44(in_register_00000084,position);
  uVar37 = coder->opts_current_index;
  uVar12 = mf->read_ahead;
  if (coder->opts_end_index == uVar37) {
    if (uVar12 == 0) {
      if (0x7f < coder->match_price_count) {
        puVar20 = coder->dist_slot_prices[0] + 0xe;
        lVar35 = 0;
        do {
          puVar28 = coder->dist_slot_prices[lVar35];
          if (coder->dist_table_size != 0) {
            uVar24 = 0;
            do {
              uVar25 = 0;
              uVar37 = (int)uVar24 + 0x40;
              do {
                uVar43 = uVar37 >> 1;
                uVar25 = uVar25 + lzma_rc_prices
                                  [(-(uVar37 & 1) & 0x7f0 ^
                                   (uint)*(ushort *)
                                          ((long)coder->dist_slot[lVar35] +
                                          (ulong)(uVar37 & 0xfffffffe))) >> 4];
                uVar37 = uVar43;
              } while (uVar43 != 1);
              puVar28[uVar24] = uVar25;
              uVar24 = uVar24 + 1;
            } while (uVar24 < coder->dist_table_size);
            if (0xe < coder->dist_table_size) {
              uVar37 = 0x70;
              lVar38 = 0;
              do {
                puVar20[lVar38] = (puVar20[lVar38] + (uVar37 & 0xfffffff0)) - 0x50;
                uVar24 = lVar38 + 0xf;
                uVar37 = uVar37 + 8;
                lVar38 = lVar38 + 1;
              } while (uVar24 < coder->dist_table_size);
            }
          }
          uVar10 = *(undefined8 *)(puVar28 + 2);
          puVar1 = coder->dist_prices[lVar35];
          *(undefined8 *)puVar1 = *(undefined8 *)puVar28;
          *(undefined8 *)(puVar1 + 2) = uVar10;
          lVar35 = lVar35 + 1;
          puVar20 = puVar20 + 0x40;
        } while (lVar35 != 4);
        puVar20 = coder->dist_prices[0] + 4;
        lVar35 = 4;
        do {
          bVar3 = ""[lVar35];
          iVar17 = (bVar3 >> 1) - 1;
          bVar42 = (byte)iVar17 & 0x1f;
          uVar43 = (bVar3 & 1 | 2) << bVar42;
          uVar26 = (int)lVar35 - uVar43;
          uVar37 = 1;
          iVar23 = 0 << bVar42;
          do {
            uVar40 = uVar26 & 1;
            uVar24 = (ulong)uVar37;
            uVar37 = uVar40 + uVar37 * 2;
            uVar26 = uVar26 >> 1;
            iVar23 = iVar23 + (uint)lzma_rc_prices
                                    [(-uVar40 & 0x7f0 ^
                                     (uint)*(ushort *)
                                            ((long)coder +
                                            uVar24 * 2 +
                                            ((ulong)uVar43 * 2 - (ulong)((uint)bVar3 + (uint)bVar3))
                                            + 0x70fa)) >> 4];
            iVar17 = iVar17 + -1;
          } while (iVar17 != 0);
          lVar38 = 0;
          do {
            *(int *)((long)puVar20 + lVar38 * 2) =
                 *(int *)((long)coder->dist_slot_prices[0] + lVar38 + (ulong)bVar3 * 4) + iVar23;
            lVar38 = lVar38 + 0x100;
          } while (lVar38 != 0x400);
          lVar35 = lVar35 + 1;
          puVar20 = puVar20 + 1;
        } while (lVar35 != 0x80);
        coder->match_price_count = 0;
      }
      if (0xf < coder->align_price_count) {
        uVar24 = 0;
        do {
          uVar37 = 1;
          iVar17 = -4;
          uVar36 = uVar24 & 0xffffffff;
          uVar25 = 0;
          do {
            uVar43 = (uint)uVar36 & 1;
            uVar41 = (ulong)uVar37;
            uVar37 = uVar43 + uVar37 * 2;
            uVar36 = uVar36 >> 1;
            uVar25 = uVar25 + lzma_rc_prices
                              [(-uVar43 & 0x7f0 ^ (uint)coder->dist_align[uVar41]) >> 4];
            iVar17 = iVar17 + 1;
          } while (iVar17 != 0);
          coder->align_prices[uVar24] = uVar25;
          uVar24 = uVar24 + 1;
        } while (uVar24 != 0x10);
        coder->align_price_count = 0;
      }
    }
    uVar37 = mf->nice_len;
    local_120 = back_res;
    local_118 = len_res;
    local_100 = mf;
    if (uVar12 == 1) {
      local_124 = coder->matches_count;
      uVar43 = coder->longest_match_length;
    }
    else {
      if (uVar12 != 0) {
        __assert_fail("mf->read_ahead == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder_optimum_normal.c"
                      ,0x11c,
                      "uint32_t helper1(lzma_lzma1_encoder *restrict, lzma_mf *restrict, uint32_t *restrict, uint32_t *restrict, uint32_t)"
                     );
      }
      uVar43 = lzma_mf_find(mf,&local_124,coder->matches);
    }
    plVar11 = local_100;
    uVar24 = (ulong)mf->read_pos;
    uVar40 = (mf->write_pos - mf->read_pos) + 1;
    uVar26 = 0x111;
    if ((uVar40 < 0x111) && (uVar26 = uVar40, uVar40 < 2)) {
      *back_res = 0xffffffff;
      *len_res = 1;
    }
    else {
      puVar9 = local_100->buffer;
      puVar20 = coder->reps;
      sVar6 = *(short *)(puVar9 + (uVar24 - 1));
      lVar35 = 0;
      uVar40 = 0;
      do {
        if (sVar6 == *(short *)(puVar9 + (uVar24 - 2) + -(ulong)puVar20[lVar35])) {
          uVar18 = uVar26;
          if (2 < uVar26) {
            uVar36 = 2;
LAB_006a3e95:
            uVar41 = *(long *)(puVar9 + uVar36 + (uVar24 - 1)) -
                     *(long *)(puVar9 + uVar36 + (uVar24 - puVar20[lVar35]) + -2);
            if (uVar41 == 0) goto code_r0x006a3ea1;
            uVar19 = 0;
            if (uVar41 != 0) {
              for (; (uVar41 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
              }
            }
            uVar18 = (int)uVar36 + ((uint)(uVar19 >> 3) & 0x1fffffff);
            if (uVar26 <= uVar18) {
              uVar18 = uVar26;
            }
          }
LAB_006a3ecc:
          local_138[lVar35] = uVar18;
          if (local_138[uVar40] < uVar18) {
            uVar40 = (uint)lVar35;
          }
        }
        else {
          local_138[lVar35] = 0;
        }
        lVar35 = lVar35 + 1;
      } while (lVar35 != 4);
      uVar26 = local_138[uVar40];
      if (uVar26 < uVar37) {
        if (uVar43 < uVar37) {
          bVar3 = puVar9[~(ulong)*puVar20 + (uVar24 - 1)];
          bVar42 = (byte)sVar6;
          if (((uVar26 < 2) && (uVar43 < 2)) && (bVar3 != bVar42)) {
            *local_120 = 0xffffffff;
          }
          else {
            uVar41 = (ulong)coder->state;
            coder->opts[0].state = coder->state;
            uVar37 = coder->pos_mask & (uint)local_b0;
            uVar36 = (ulong)(coder->is_match[uVar41][uVar37] >> 4);
            bVar4 = lzma_rc_prices[uVar36];
            uVar12 = get_literal_price(coder,(uint)local_b0,(uint)puVar9[uVar24 - 2],6 < uVar41,
                                       (uint)bVar3,(uint)bVar42);
            coder->opts[1].price = uVar12 + bVar4;
            coder->opts[1].back_prev = 0xffffffff;
            coder->opts[1].prev_1_is_literal = false;
            bVar5 = lzma_rc_prices[uVar36 ^ 0x7f];
            uVar24 = (ulong)(coder->is_rep[uVar41] >> 4);
            iVar17 = (uint)lzma_rc_prices[uVar24 ^ 0x7f] + (uint)bVar5;
            uVar25 = 0xffffffff;
            if ((bVar3 == bVar42) &&
               (uVar40 = (uint)lzma_rc_prices[coder->is_rep0_long[uVar41][uVar37] >> 4] +
                         (uint)lzma_rc_prices[coder->is_rep0[uVar41] >> 4] + iVar17,
               uVar40 < uVar12 + bVar4)) {
              coder->opts[1].price = uVar40;
              coder->opts[1].back_prev = 0;
              uVar25 = 0;
            }
            if (uVar26 < uVar43) {
              uVar26 = uVar43;
            }
            local_190 = (ulong)uVar26;
            if (1 < uVar26) {
              local_d0 = coder->is_match;
              coder->opts[1].pos_prev = 0;
              local_c0 = coder->opts[0].backs;
              uVar10 = *(undefined8 *)(coder->reps + 2);
              *(undefined8 *)coder->opts[0].backs = *(undefined8 *)coder->reps;
              *(undefined8 *)(coder->opts[0].backs + 2) = uVar10;
              auVar60 = _DAT_00824820;
              auVar62 = _DAT_007c9490;
              auVar61 = _DAT_007c9480;
              uVar40 = uVar26 - 2;
              auVar45._4_4_ = 0;
              auVar45._0_4_ = uVar40;
              auVar45._8_4_ = uVar40;
              auVar45._12_4_ = 0;
              puVar28 = coder->align_prices + local_190 * 0xb + -10;
              uVar36 = 0;
              auVar45 = auVar45 ^ _DAT_007c9490;
              do {
                auVar57._8_4_ = (int)uVar36;
                auVar57._0_8_ = uVar36;
                auVar57._12_4_ = (int)(uVar36 >> 0x20);
                auVar59 = (auVar57 | auVar61) ^ auVar62;
                iVar23 = auVar45._0_4_;
                bVar44 = iVar23 < auVar59._0_4_;
                iVar50 = auVar45._4_4_;
                iVar27 = auVar59._4_4_;
                if ((bool)(~(iVar50 < iVar27 || iVar27 == iVar50 && bVar44) & 1)) {
                  puVar28[0x21] = 0x40000000;
                }
                if (iVar50 >= iVar27 && (iVar27 != iVar50 || !bVar44)) {
                  puVar28[0x16] = 0x40000000;
                }
                auVar57 = (auVar57 | auVar60) ^ auVar62;
                iVar27 = auVar57._4_4_;
                if (iVar27 <= iVar50 && (iVar27 != iVar50 || auVar57._0_4_ <= iVar23)) {
                  puVar28[0xb] = 0x40000000;
                  *puVar28 = 0x40000000;
                }
                uVar36 = uVar36 + 4;
                puVar28 = puVar28 + -0x2c;
              } while (((ulong)uVar40 + 4 & 0xfffffffffffffffc) != uVar36);
              local_b8 = coder->is_rep0_long;
              local_c8 = (coder->rep_len_encoder).prices;
              lVar35 = 0;
              do {
                uVar40 = local_138[lVar35];
                if (1 < uVar40) {
                  uVar36 = (ulong)(coder->is_rep0[uVar41] >> 4);
                  if (lVar35 == 0) {
                    uVar18 = (uint)lzma_rc_prices[uVar36];
                    bVar3 = lzma_rc_prices[(ulong)(coder->is_rep0_long[uVar41][uVar37] >> 4) ^ 0x7f]
                    ;
LAB_006a4355:
                    iVar23 = bVar3 + uVar18;
                  }
                  else {
                    uVar19 = (ulong)(coder->is_rep1[uVar41] >> 4);
                    if (lVar35 != 1) {
                      uVar18 = (uint)lzma_rc_prices[uVar19 ^ 0x7f] +
                               (uint)lzma_rc_prices[uVar36 ^ 0x7f];
                      bVar3 = lzma_rc_prices
                              [(2 - (uint32_t)lVar35 & 0x7f0 ^ (uint)coder->is_rep2[uVar41]) >> 4];
                      goto LAB_006a4355;
                    }
                    iVar23 = (uint)lzma_rc_prices[uVar19] + (uint)lzma_rc_prices[uVar36 ^ 0x7f];
                  }
                  puVar28 = (coder->rep_len_encoder).prices[uVar37] + (uVar40 - 2);
                  do {
                    uVar18 = *puVar28 + iVar23 + iVar17;
                    if (uVar18 < coder->opts[uVar40].price) {
                      coder->opts[uVar40].price = uVar18;
                      coder->opts[uVar40].pos_prev = 0;
                      coder->opts[uVar40].back_prev = (uint32_t)lVar35;
                      coder->opts[uVar40].prev_1_is_literal = false;
                    }
                    uVar40 = uVar40 - 1;
                    puVar28 = puVar28 + -1;
                  } while (1 < uVar40);
                }
                lVar35 = lVar35 + 1;
              } while (lVar35 != 4);
              uVar36 = 2;
              if (1 < local_138[0]) {
                uVar36 = (ulong)(local_138[0] + 1);
              }
              if ((uint)uVar36 <= uVar43) {
                bVar3 = lzma_rc_prices[uVar24];
                uVar24 = 0xffffffff;
                do {
                  uVar24 = (ulong)((int)uVar24 + 1);
                } while (coder->matches[uVar24].len < (uint)uVar36);
                while( true ) {
                  uVar43 = coder->matches[uVar24].dist;
                  uVar40 = (uint)uVar36;
                  uVar18 = 3;
                  if (uVar40 < 6) {
                    uVar18 = uVar40 - 2;
                  }
                  if ((ulong)uVar43 < 0x80) {
                    uVar12 = coder->dist_prices[uVar18][uVar43];
                  }
                  else {
                    sVar16 = 0x1e;
                    if (-1 < (int)uVar43) {
                      sVar16 = 0x12;
                    }
                    iVar17 = 0x3c;
                    if (-1 < (int)uVar43) {
                      iVar17 = 0x24;
                    }
                    if (uVar43 < 0x80000) {
                      sVar16 = 6;
                    }
                    if (uVar43 < 0x80000) {
                      iVar17 = 0xc;
                    }
                    uVar12 = coder->align_prices[uVar43 & 0xf] +
                             coder->dist_slot_prices[uVar18][(uint)""[uVar43 >> sVar16] + iVar17];
                  }
                  uVar18 = uVar12 + (uint)bVar3 + (uint)bVar5 +
                           (coder->match_len_encoder).prices[uVar37][uVar40 - 2];
                  if (uVar18 < coder->opts[uVar36].price) {
                    coder->opts[uVar36].price = uVar18;
                    coder->opts[uVar36].pos_prev = 0;
                    coder->opts[uVar36].back_prev = uVar43 + 4;
                    coder->opts[uVar36].prev_1_is_literal = false;
                  }
                  uVar43 = coder->matches[uVar24].len;
                  uVar18 = (int)uVar24 + 1;
                  if ((uVar40 == uVar43) && (uVar18 == local_124)) break;
                  uVar41 = (ulong)uVar18;
                  if (uVar40 != uVar43) {
                    uVar41 = uVar24;
                  }
                  uVar36 = (ulong)(uVar40 + 1);
                  uVar24 = uVar41;
                }
              }
              if (uVar26 == 0xffffffff) {
                return;
              }
              local_138[0] = (uint)*(undefined8 *)puVar20;
              local_138[1] = (uint)((ulong)*(undefined8 *)puVar20 >> 0x20);
              local_138[2] = (uint)*(undefined8 *)(coder->reps + 2);
              uStack_12c = (uint32_t)((ulong)*(undefined8 *)(coder->reps + 2) >> 0x20);
              local_70 = &coder->matches_count;
              local_e8 = coder->matches;
              local_a0 = (coder->match_len_encoder).prices;
              local_38 = coder->dist_slot_prices;
              local_40 = coder->dist_prices;
              local_68 = coder->opts[1].backs;
              local_f8 = &coder->opts[4].price;
              local_d4 = ~(uint)local_b0;
              local_dc = 0xffe;
              local_d8 = -2;
              lVar35 = 0;
              uVar24 = 1;
              do {
                puVar20 = local_70;
                plVar11 = local_100;
                if (lVar35 == 0xfff) {
                  __assert_fail("cur < OPTS",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder_optimum_normal.c"
                                ,0x34c,
                                "void lzma_lzma_optimum_normal(lzma_lzma1_encoder *restrict, lzma_mf *restrict, uint32_t *restrict, uint32_t *restrict, uint32_t)"
                               );
                }
                uVar12 = lzma_mf_find(local_100,local_70,local_e8);
                local_60 = CONCAT44(extraout_var,uVar12);
                coder->longest_match_length = uVar12;
                uVar37 = plVar11->nice_len;
                if (uVar37 <= uVar12) {
                  local_80 = uVar24 & 0xffffffff;
                  break;
                }
                puVar9 = plVar11->buffer;
                uVar43 = plVar11->read_pos;
                local_8c = (plVar11->write_pos - uVar43) + 1;
                uVar12 = (uint32_t)uVar24;
                uVar26 = 0xfff - uVar12;
                if (local_8c < 0xfff - uVar12) {
                  uVar26 = local_8c;
                }
                uVar40 = *puVar20;
                plVar2 = &coder->opts[uVar24].state;
                uVar18 = coder->opts[uVar24].pos_prev;
                uVar36 = (ulong)uVar18;
                if (coder->opts[uVar24].prev_1_is_literal == true) {
                  if (*(_Bool *)((long)plVar2 + 5) == true) {
                    uVar41 = (ulong)plVar2[2];
                    bVar44 = coder->opts[uVar41].state < STATE_LIT_MATCH;
                    uVar18 = plVar2[3];
                    uVar29 = (uint)!bVar44;
                    iVar17 = uVar29 * 3 + 7;
                    if (uVar18 < 4) {
                      iVar17 = uVar29 * 3 + 8;
                    }
                    lVar21 = ((uint)bVar44 * 3 + iVar17) - STATE_SHORTREP_LIT;
                    if (uVar24 != uVar36) {
                      lVar39 = (uint)(STATE_SHORTREP_LIT < lVar21) * 3 + STATE_LIT_LONGREP;
                      if (3 < uVar18) goto LAB_006a46bb;
LAB_006a464d:
                      local_138[0] = coder->opts[uVar41].backs[uVar18];
                      if (uVar18 == 0) {
                        uVar29 = 1;
                      }
                      else {
                        uVar29 = uVar18 + 1;
                        memcpy(local_138 + 1,local_c0 + uVar41 * 0xb,(ulong)uVar29 * 4 - 4);
                        if (2 < uVar18) goto LAB_006a46e8;
                      }
                      puVar20 = local_c0;
                      uVar36 = (ulong)uVar29;
                      do {
                        local_138[uVar36] = puVar20[uVar41 * 0xb + uVar36];
                        uVar36 = uVar36 + 1;
                      } while ((int)uVar36 != 4);
                      goto LAB_006a46e8;
                    }
                  }
                  else {
                    uVar18 = uVar18 - 1;
                    lVar39 = coder->opts[uVar18].state;
                    lVar21 = (lVar39 - STATE_SHORTREP_LIT) + (uint)(lVar39 < STATE_NONLIT_MATCH) * 3
                    ;
                    if (lVar39 < STATE_MATCH_LIT) {
                      lVar21 = STATE_LIT_LIT;
                    }
                    uVar41 = (ulong)uVar18;
                    if (uVar24 != uVar36) goto LAB_006a45ee;
                  }
LAB_006a4597:
                  if (plVar2[6] == 0) {
                    lVar39 = (uint)(STATE_SHORTREP_LIT < lVar21) * 2 + STATE_LIT_SHORTREP;
                  }
                  else {
                    lVar39 = (lVar21 - STATE_SHORTREP_LIT) + (uint)(lVar21 < STATE_NONLIT_MATCH) * 3
                    ;
                    if (lVar21 < STATE_MATCH_LIT) {
                      lVar39 = STATE_LIT_LIT;
                    }
                  }
                }
                else {
                  lVar21 = coder->opts[uVar36].state;
                  uVar41 = uVar36;
                  if (uVar24 - 1 == uVar36) goto LAB_006a4597;
LAB_006a45ee:
                  uVar18 = plVar2[6];
                  if (uVar18 < 4) {
                    lVar39 = (uint)(STATE_SHORTREP_LIT < lVar21) * 3 + STATE_LIT_LONGREP;
                    goto LAB_006a464d;
                  }
                  lVar39 = (uint)(STATE_SHORTREP_LIT < lVar21) * 3 + STATE_LIT_MATCH;
LAB_006a46bb:
                  local_138[0] = uVar18 - 4;
                  uStack_12c = local_c0[uVar41 * 0xb + 2];
                  local_138[1] = (uint)*(undefined8 *)(local_c0 + uVar41 * 0xb);
                  local_138[2] = (uint)((ulong)*(undefined8 *)(local_c0 + uVar41 * 0xb) >> 0x20);
                }
LAB_006a46e8:
                puVar20 = local_68 + lVar35 * 0xb;
                local_98 = puVar9 + uVar43;
                uVar29 = uVar12 + (int)local_b0;
                local_f0 = (ulong)uVar29;
                *plVar2 = lVar39;
                *puVar20 = local_138[0];
                *(ulong *)(puVar20 + 1) = CONCAT44(local_138[2],local_138[1]);
                puVar20[3] = uStack_12c;
                uVar25 = plVar2[4];
                bVar3 = local_98[-1];
                local_108 = (uint32_t (*) [272])(ulong)local_138[0];
                bVar42 = local_98[-2 - (long)local_108];
                uVar18 = coder->pos_mask;
                uVar22 = uVar18 & uVar29;
                uVar7 = local_d0[lVar39][uVar22] >> 4;
                bVar4 = lzma_rc_prices[uVar7];
                uVar13 = get_literal_price(coder,uVar29,(uint)local_98[-2],
                                           STATE_SHORTREP_LIT < lVar39,(uint)bVar42,(uint)bVar3);
                uVar14 = uVar13 + uVar25 + (uint)bVar4;
                local_80 = uVar24 + 1;
                uVar29 = coder->opts[uVar24 + 1].price;
                bVar44 = uVar14 < uVar29;
                if (bVar44) {
                  coder->opts[uVar24 + 1].price = uVar14;
                  coder->opts[uVar24 + 1].pos_prev = uVar12;
                  coder->opts[uVar24 + 1].back_prev = 0xffffffff;
                  coder->opts[uVar24 + 1].prev_1_is_literal = false;
                  uVar29 = uVar14;
                }
                auVar60 = _DAT_00824820;
                auVar62 = _DAT_007c9490;
                auVar61 = _DAT_007c9480;
                iVar23 = uVar25 + lzma_rc_prices[(ulong)uVar7 ^ 0x7f];
                uVar36 = (ulong)(coder->is_rep[lVar39] >> 4);
                iVar17 = (uint)lzma_rc_prices[uVar36 ^ 0x7f] + iVar23;
                if ((bVar42 == bVar3) &&
                   (((uVar24 <= coder->opts[uVar24 + 1].pos_prev ||
                     (coder->opts[uVar24 + 1].back_prev != 0)) &&
                    (uVar31 = (uint)lzma_rc_prices[local_b8[lVar39][uVar22] >> 4] +
                              (uint)lzma_rc_prices[coder->is_rep0[lVar39] >> 4] + iVar17,
                    uVar31 <= uVar29)))) {
                  coder->opts[uVar24 + 1].price = uVar31;
                  coder->opts[uVar24 + 1].pos_prev = uVar12;
                  coder->opts[uVar24 + 1].back_prev = 0;
                  coder->opts[uVar24 + 1].prev_1_is_literal = false;
                  bVar44 = true;
                }
                if (1 < uVar26) {
                  psVar34 = (short *)(puVar9 + ((ulong)uVar43 - 1));
                  uVar43 = uVar37;
                  if (uVar26 < uVar37) {
                    uVar43 = uVar26;
                  }
                  uVar24 = (ulong)uVar43;
                  local_110 = CONCAT44(local_110._4_4_,uVar43);
                  local_78 = uVar36;
                  if (!(bool)(bVar42 == bVar3 | bVar44)) {
                    uVar43 = uVar37 + 1;
                    if (uVar26 <= uVar37 + 1) {
                      uVar43 = uVar26;
                    }
                    if (uVar37 == 0xffffffff) {
LAB_006a5a78:
                      __assert_fail("len <= limit",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                                    ,0x2e,
                                    "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                                   );
                    }
                    uVar29 = uVar43;
                    if (1 < uVar43) {
                      uVar31 = 1;
LAB_006a494b:
                      uVar36 = *(long *)((long)psVar34 + (ulong)uVar31) -
                               *(long *)((long)psVar34 + (ulong)uVar31 + ~(ulong)local_108);
                      if (uVar36 == 0) goto code_r0x006a4957;
                      uVar41 = 0;
                      if (uVar36 != 0) {
                        for (; (uVar36 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
                        }
                      }
                      uVar29 = ((uint)(uVar41 >> 3) & 0x1fffffff) + uVar31;
                      if (uVar43 <= uVar29) {
                        uVar29 = uVar43;
                      }
                    }
LAB_006a4999:
                    if (uVar29 - 3 < 0xfffffffe) {
                      uVar43 = (lVar39 - STATE_SHORTREP_LIT) +
                               (uint)(lVar39 < STATE_NONLIT_MATCH) * 3;
                      if (lVar39 < STATE_MATCH_LIT) {
                        uVar43 = 0;
                      }
                      uVar32 = (int)local_f0 + 1U & uVar18;
                      uVar7 = local_d0[uVar43][uVar32];
                      uVar8 = coder->is_rep[uVar43];
                      uVar31 = uVar29 + uVar12;
                      uVar36 = (ulong)uVar31;
                      if ((uint)local_190 < uVar31) {
                        lVar38 = ~local_190 + uVar36;
                        auVar59._8_4_ = (int)lVar38;
                        auVar59._0_8_ = lVar38;
                        auVar59._12_4_ = (int)((ulong)lVar38 >> 0x20);
                        puVar20 = local_f8 + local_190 * 0xb;
                        uVar41 = 0;
                        do {
                          auVar52._8_4_ = (int)uVar41;
                          auVar52._0_8_ = uVar41;
                          auVar52._12_4_ = (int)(uVar41 >> 0x20);
                          auVar45 = (auVar52 | auVar61) ^ auVar62;
                          iVar50 = SUB164(auVar59 ^ auVar62,0);
                          bVar44 = iVar50 < auVar45._0_4_;
                          iVar27 = SUB164(auVar59 ^ auVar62,4);
                          iVar51 = auVar45._4_4_;
                          if ((bool)(~(iVar27 < iVar51 || iVar51 == iVar27 && bVar44) & 1)) {
                            puVar20[-0x21] = 0x40000000;
                          }
                          if (iVar27 >= iVar51 && (iVar51 != iVar27 || !bVar44)) {
                            puVar20[-0x16] = 0x40000000;
                          }
                          auVar45 = (auVar52 | auVar60) ^ auVar62;
                          iVar51 = auVar45._4_4_;
                          if (iVar51 <= iVar27 && (iVar51 != iVar27 || auVar45._0_4_ <= iVar50)) {
                            puVar20[-0xb] = 0x40000000;
                            *puVar20 = 0x40000000;
                          }
                          uVar41 = uVar41 + 4;
                          puVar20 = puVar20 + 0x2c;
                        } while ((((uVar29 + uVar12) - local_190) + 3 & 0xfffffffffffffffc) !=
                                 uVar41);
                        local_190 = (ulong)uVar31;
                      }
                      uVar43 = uVar14 + lzma_rc_prices[(ulong)(uVar7 >> 4) ^ 0x7f] +
                               (uint)lzma_rc_prices[(ulong)(uVar8 >> 4) ^ 0x7f] +
                               local_c8[uVar32][uVar29 - 3] +
                               (uint)lzma_rc_prices[(ulong)(local_b8[uVar43][uVar32] >> 4) ^ 0x7f] +
                               (uint)lzma_rc_prices[coder->is_rep0[uVar43] >> 4];
                      if (uVar43 < coder->opts[uVar36].price) {
                        coder->opts[uVar36].price = uVar43;
                        coder->opts[uVar36].pos_prev = (uint32_t)local_80;
                        coder->opts[uVar36].back_prev = 0;
                        coder->opts[uVar36].prev_1_is_literal = true;
                        coder->opts[uVar36].prev_2 = false;
                      }
                    }
                  }
                  local_98 = local_98 + -2;
                  local_58 = local_b8[lVar39] + uVar22;
                  local_108 = local_c8 + uVar22;
                  local_160 = 2;
                  local_50 = (long)*local_d0 +
                             (ulong)(((uint)(STATE_SHORTREP_LIT < lVar39) * 3 + 8) * 0x20);
                  lVar38 = 0;
                  do {
                    psVar15 = (short *)(local_98 + -(ulong)local_138[lVar38]);
                    if (*psVar34 == *psVar15) {
                      uVar43 = (uint)uVar24;
                      if (uVar43 < 2) goto LAB_006a5a78;
                      uVar36 = 2;
                      if (2 < uVar43) {
                        uVar29 = 2;
LAB_006a4c6a:
                        uVar36 = *(long *)((long)psVar34 + (ulong)uVar29) -
                                 *(long *)((long)psVar15 + (ulong)uVar29);
                        if (uVar36 == 0) goto code_r0x006a4c76;
                        uVar41 = 0;
                        if (uVar36 != 0) {
                          for (; (uVar36 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
                          }
                        }
                        uVar29 = ((uint)(uVar41 >> 3) & 0x1fffffff) + uVar29;
                        uVar36 = (ulong)uVar29;
                        if (uVar43 <= uVar29) {
                          uVar36 = uVar24;
                        }
                      }
LAB_006a4c8f:
                      iVar50 = (int)uVar36;
                      uVar29 = iVar50 + uVar12;
                      uVar43 = (uint)local_190;
                      if ((uint)local_190 < uVar29) {
                        lVar30 = ~local_190 + (ulong)uVar29;
                        auVar46._8_4_ = (int)lVar30;
                        auVar46._0_8_ = lVar30;
                        auVar46._12_4_ = (int)((ulong)lVar30 >> 0x20);
                        puVar20 = local_f8 + local_190 * 0xb;
                        uVar24 = 0;
                        do {
                          auVar53._8_4_ = (int)uVar24;
                          auVar53._0_8_ = uVar24;
                          auVar53._12_4_ = (int)(uVar24 >> 0x20);
                          auVar45 = (auVar53 | auVar61) ^ auVar62;
                          iVar27 = SUB164(auVar46 ^ auVar62,0);
                          bVar44 = iVar27 < auVar45._0_4_;
                          iVar51 = SUB164(auVar46 ^ auVar62,4);
                          iVar58 = auVar45._4_4_;
                          if ((bool)(~(iVar51 < iVar58 || iVar58 == iVar51 && bVar44) & 1)) {
                            puVar20[-0x21] = 0x40000000;
                          }
                          if (iVar51 >= iVar58 && (iVar58 != iVar51 || !bVar44)) {
                            puVar20[-0x16] = 0x40000000;
                          }
                          auVar45 = (auVar53 | auVar60) ^ auVar62;
                          iVar58 = auVar45._4_4_;
                          if (iVar58 <= iVar51 && (iVar58 != iVar51 || auVar45._0_4_ <= iVar27)) {
                            puVar20[-0xb] = 0x40000000;
                            *puVar20 = 0x40000000;
                          }
                          uVar24 = uVar24 + 4;
                          puVar20 = puVar20 + 0x2c;
                          uVar43 = uVar29;
                        } while ((((iVar50 + uVar12) - local_190) + 3 & 0xfffffffffffffffc) !=
                                 uVar24);
                      }
                      uVar7 = coder->is_rep0[lVar39] >> 4;
                      uVar25 = (uint32_t)lVar38;
                      if (lVar38 == 0) {
                        bVar3 = lzma_rc_prices[uVar7];
                        uVar24 = (ulong)(*local_58 >> 4) ^ 0x7f;
LAB_006a4e2d:
                        iVar27 = (uint)lzma_rc_prices[uVar24] + (uint)bVar3;
                      }
                      else {
                        bVar3 = lzma_rc_prices[(ulong)uVar7 ^ 0x7f];
                        uVar7 = coder->is_rep1[lVar39] >> 4;
                        uVar24 = (ulong)uVar7;
                        if (lVar38 == 1) goto LAB_006a4e2d;
                        iVar27 = (uint)lzma_rc_prices
                                       [(2 - uVar25 & 0x7f0 ^ (uint)coder->is_rep2[lVar39]) >> 4] +
                                 (uint)lzma_rc_prices[(ulong)uVar7 ^ 0x7f] + (uint)bVar3;
                      }
                      iVar27 = iVar27 + iVar17;
                      puVar20 = *local_108 + (iVar50 - 2U);
                      uVar24 = uVar36;
                      do {
                        uVar14 = *puVar20 + iVar27;
                        uVar31 = (int)uVar24 + uVar12;
                        if (uVar14 < coder->opts[uVar31].price) {
                          coder->opts[uVar31].price = uVar14;
                          coder->opts[uVar31].pos_prev = uVar12;
                          coder->opts[uVar31].back_prev = uVar25;
                          coder->opts[uVar31].prev_1_is_literal = false;
                        }
                        uVar14 = (int)uVar24 - 1;
                        uVar24 = (ulong)uVar14;
                        puVar20 = puVar20 + -1;
                      } while (1 < uVar14);
                      uVar14 = iVar50 + 1;
                      if (lVar38 == 0) {
                        local_160 = uVar14;
                      }
                      uVar31 = iVar50 + uVar37 + 1;
                      if (uVar26 <= uVar31) {
                        uVar31 = uVar26;
                      }
                      uVar32 = uVar14;
                      uVar33 = uVar14;
                      if (uVar14 < uVar31) {
LAB_006a4ead:
                        uVar24 = *(long *)((long)psVar34 + (ulong)uVar33) -
                                 *(long *)((long)psVar15 + (ulong)uVar33);
                        if (uVar24 == 0) goto code_r0x006a4eba;
                        uVar41 = 0;
                        if (uVar24 != 0) {
                          for (; (uVar24 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
                          }
                        }
                        uVar32 = ((uint)(uVar41 >> 3) & 0x1fffffff) + uVar33;
                        if (uVar31 <= uVar32) {
                          uVar32 = uVar31;
                        }
                      }
LAB_006a4eec:
                      if (1 < uVar32 - uVar14) {
                        uVar31 = iVar50 + (int)local_f0;
                        local_a8 = CONCAT44(local_a8._4_4_,(*local_108)[iVar50 - 2U]);
                        local_84 = (uint)lzma_rc_prices
                                         [*(ushort *)(local_50 + (ulong)(uVar31 & uVar18) * 2) >> 4]
                        ;
                        local_48 = (ulong)(uVar32 - uVar14);
                        local_88 = get_literal_price(coder,uVar31,
                                                     (uint)*(byte *)((long)psVar34 +
                                                                    (ulong)(iVar50 - 1)),true,
                                                     (uint)*(byte *)((long)psVar15 + uVar36),
                                                     (uint)*(byte *)((long)psVar34 + uVar36));
                        auVar60 = _DAT_00824820;
                        auVar62 = _DAT_007c9490;
                        auVar61 = _DAT_007c9480;
                        uVar31 = iVar50 + (int)local_f0 + 1U & uVar18;
                        uVar7 = coder->is_match[5][uVar31];
                        uVar8 = coder->is_rep[5];
                        uVar14 = uVar29 + (int)local_48 + 1;
                        if (uVar43 < uVar14) {
                          lVar30 = ~(ulong)uVar43 + (ulong)uVar14;
                          uVar24 = (ulong)(iVar50 + uVar12);
                          if (iVar50 + uVar12 < local_190) {
                            uVar24 = local_190;
                          }
                          auVar47._8_4_ = (int)lVar30;
                          auVar47._0_8_ = lVar30;
                          auVar47._12_4_ = (int)((ulong)lVar30 >> 0x20);
                          puVar20 = local_f8 + uVar24 * 0xb;
                          uVar36 = 0;
                          do {
                            auVar54._8_4_ = (int)uVar36;
                            auVar54._0_8_ = uVar36;
                            auVar54._12_4_ = (int)(uVar36 >> 0x20);
                            auVar45 = (auVar54 | auVar61) ^ auVar62;
                            iVar50 = SUB164(auVar47 ^ auVar62,0);
                            bVar44 = iVar50 < auVar45._0_4_;
                            iVar51 = SUB164(auVar47 ^ auVar62,4);
                            iVar58 = auVar45._4_4_;
                            if ((bool)(~(iVar51 < iVar58 || iVar58 == iVar51 && bVar44) & 1)) {
                              puVar20[-0x21] = 0x40000000;
                            }
                            if (iVar51 >= iVar58 && (iVar58 != iVar51 || !bVar44)) {
                              puVar20[-0x16] = 0x40000000;
                            }
                            auVar45 = (auVar54 | auVar60) ^ auVar62;
                            iVar58 = auVar45._4_4_;
                            if (iVar58 <= iVar51 && (iVar58 != iVar51 || auVar45._0_4_ <= iVar50)) {
                              puVar20[-0xb] = 0x40000000;
                              *puVar20 = 0x40000000;
                            }
                            uVar36 = uVar36 + 4;
                            puVar20 = puVar20 + 0x2c;
                            uVar43 = uVar14;
                          } while ((((uVar32 + uVar12) - uVar24) + 3 & 0xfffffffffffffffc) != uVar36
                                  );
                        }
                        uVar31 = (int)local_a8 + iVar27 + local_88 + local_84 +
                                 (uint)lzma_rc_prices[(ulong)(uVar7 >> 4) ^ 0x7f] +
                                 (uint)lzma_rc_prices[(ulong)(uVar8 >> 4) ^ 0x7f] +
                                 local_c8[uVar31][(int)local_48 - 2] +
                                 (uint)lzma_rc_prices
                                       [(ulong)(coder->is_rep0_long[5][uVar31] >> 4) ^ 0x7f] +
                                 (uint)lzma_rc_prices[coder->is_rep0[5] >> 4];
                        if (uVar31 < coder->opts[uVar14].price) {
                          coder->opts[uVar14].price = uVar31;
                          coder->opts[uVar14].pos_prev = uVar29 + 1;
                          coder->opts[uVar14].back_prev = 0;
                          coder->opts[uVar14].prev_1_is_literal = true;
                          coder->opts[uVar14].prev_2 = true;
                          coder->opts[uVar14].pos_prev_2 = uVar12;
                          coder->opts[uVar14].back_prev_2 = uVar25;
                        }
                      }
                      local_190 = (ulong)uVar43;
                      uVar24 = local_110 & 0xffffffff;
                    }
                    lVar38 = lVar38 + 1;
                  } while (lVar38 != 4);
                  uVar43 = (uint)local_60;
                  uVar14 = (uint)uVar24;
                  uVar29 = uVar43;
                  if (uVar14 < uVar43) {
                    uVar40 = 0;
                    do {
                      uVar29 = uVar40;
                      uVar40 = uVar29 + 1;
                    } while (local_e8[uVar29].len < uVar14);
                    local_e8[uVar29].len = uVar14;
                    uVar29 = uVar14;
                  }
                  if (local_160 <= uVar29) {
                    uVar29 = uVar29 + uVar12;
                    if ((uint)local_190 < uVar29) {
                      lVar38 = ~local_190 + (ulong)uVar29;
                      if (uVar37 <= uVar43) {
                        uVar43 = uVar37;
                      }
                      if (local_dc <= uVar43) {
                        uVar43 = local_dc;
                      }
                      if (local_8c <= uVar43) {
                        uVar43 = local_8c;
                      }
                      auVar48._8_4_ = (int)lVar38;
                      auVar48._0_8_ = lVar38;
                      auVar48._12_4_ = (int)((ulong)lVar38 >> 0x20);
                      puVar20 = local_f8 + local_190 * 0xb;
                      uVar24 = 0;
                      do {
                        auVar55._8_4_ = (int)uVar24;
                        auVar55._0_8_ = uVar24;
                        auVar55._12_4_ = (int)(uVar24 >> 0x20);
                        auVar45 = (auVar55 | auVar61) ^ auVar62;
                        iVar17 = SUB164(auVar48 ^ auVar62,0);
                        bVar44 = iVar17 < auVar45._0_4_;
                        iVar50 = SUB164(auVar48 ^ auVar62,4);
                        iVar27 = auVar45._4_4_;
                        if ((bool)(~(iVar50 < iVar27 || iVar27 == iVar50 && bVar44) & 1)) {
                          puVar20[-0x21] = 0x40000000;
                        }
                        if (iVar50 >= iVar27 && (iVar27 != iVar50 || !bVar44)) {
                          puVar20[-0x16] = 0x40000000;
                        }
                        auVar45 = (auVar55 | auVar60) ^ auVar62;
                        iVar27 = auVar45._4_4_;
                        if (iVar27 <= iVar50 && (iVar27 != iVar50 || auVar45._0_4_ <= iVar17)) {
                          puVar20[-0xb] = 0x40000000;
                          *puVar20 = 0x40000000;
                        }
                        uVar24 = uVar24 + 4;
                        puVar20 = puVar20 + 0x2c;
                      } while ((((uVar43 + uVar12) - local_190) + 3 & 0xfffffffffffffffc) != uVar24)
                      ;
                      local_190 = (ulong)uVar29;
                    }
                    bVar3 = lzma_rc_prices[local_78];
                    uVar24 = 0xffffffff;
                    do {
                      uVar24 = (ulong)((int)uVar24 + 1);
                    } while (local_e8[uVar24].len < local_160);
                    local_110 = (ulong)-local_d4;
                    local_a8 = (ulong)(uint)-local_d8;
                    local_f0 = (long)*local_d0 +
                               (ulong)(((uint)(STATE_SHORTREP_LIT < lVar39) * 3 + 7) * 0x20);
                    do {
                      uVar43 = local_e8[uVar24].dist;
                      uVar36 = (ulong)uVar43;
                      iVar17 = 0x3c;
                      if (-1 < (int)uVar43) {
                        iVar17 = 0x24;
                      }
                      sVar16 = 0x1e;
                      if (-1 < (int)uVar43) {
                        sVar16 = 0x12;
                      }
                      if (uVar43 < 0x80000) {
                        iVar17 = 0xc;
                      }
                      uVar29 = local_e8[uVar24].len;
                      if (uVar43 < 0x80000) {
                        sVar16 = 6;
                      }
                      while( true ) {
                        uVar14 = 3;
                        if (local_160 < 6) {
                          uVar14 = local_160 - 2;
                        }
                        if (uVar43 < 0x80) {
                          uVar25 = local_40[uVar14][uVar36];
                        }
                        else {
                          uVar25 = coder->align_prices[uVar43 & 0xf] +
                                   local_38[uVar14][(uint)""[uVar43 >> sVar16] + iVar17];
                        }
                        uVar14 = uVar25 + iVar23 + (uint)bVar3 + local_a0[uVar22][local_160 - 2];
                        uVar31 = (int)lVar35 + local_160 + 1;
                        if (uVar14 < coder->opts[uVar31].price) {
                          coder->opts[uVar31].price = uVar14;
                          coder->opts[uVar31].pos_prev = uVar12;
                          coder->opts[uVar31].back_prev = uVar43 + 4;
                          coder->opts[uVar31].prev_1_is_literal = false;
                        }
                        if (local_160 == uVar29) break;
                        local_160 = local_160 + 1;
                      }
                      uVar31 = local_160 + 1;
                      uVar29 = uVar37 + 1 + local_160;
                      if (uVar26 <= uVar29) {
                        uVar29 = uVar26;
                      }
                      uVar32 = uVar31;
                      uVar33 = uVar31;
                      if (uVar31 < uVar29) {
LAB_006a554d:
                        uVar41 = *(long *)((long)psVar34 + (ulong)uVar32) -
                                 *(long *)(local_98 + (uVar32 - uVar36));
                        if (uVar41 == 0) goto code_r0x006a5559;
                        uVar19 = 0;
                        if (uVar41 != 0) {
                          for (; (uVar41 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                          }
                        }
                        uVar33 = ((uint)(uVar19 >> 3) & 0x1fffffff) + uVar32;
                        if (uVar29 <= uVar33) {
                          uVar33 = uVar29;
                        }
                      }
LAB_006a5572:
                      if (1 < ~local_160 + uVar33) {
                        uVar29 = (int)local_110 + local_160;
                        uVar32 = uVar29 & uVar18;
                        local_108 = (uint32_t (*) [272])
                                    CONCAT44(local_108._4_4_,
                                             (uint)lzma_rc_prices
                                                   [*(ushort *)(local_f0 + (ulong)uVar32 * 2) >> 4])
                        ;
                        uVar25 = get_literal_price(coder,uVar29,
                                                   (uint)*(byte *)((long)psVar34 +
                                                                  (ulong)(local_160 - 1)),true,
                                                   (uint)local_98[local_160 - uVar36],
                                                   (uint)*(byte *)((long)psVar34 + (ulong)local_160)
                                                  );
                        auVar60 = _DAT_00824820;
                        auVar62 = _DAT_007c9490;
                        auVar61 = _DAT_007c9480;
                        uVar29 = uVar32 + 1 & uVar18;
                        uVar7 = coder->is_match[4][uVar29];
                        uVar8 = coder->is_rep[4];
                        uVar13 = (int)local_a8 + local_160;
                        uVar32 = ~local_160 + uVar33 + uVar13;
                        uVar36 = (ulong)uVar32;
                        if ((uint)local_190 < uVar32) {
                          lVar38 = ~local_190 + uVar36;
                          auVar49._8_4_ = (int)lVar38;
                          auVar49._0_8_ = lVar38;
                          auVar49._12_4_ = (int)((ulong)lVar38 >> 0x20);
                          puVar20 = local_f8 + local_190 * 0xb;
                          uVar41 = 0;
                          do {
                            auVar56._8_4_ = (int)uVar41;
                            auVar56._0_8_ = uVar41;
                            auVar56._12_4_ = (int)(uVar41 >> 0x20);
                            auVar45 = (auVar56 | auVar61) ^ auVar62;
                            iVar17 = SUB164(auVar49 ^ auVar62,0);
                            bVar44 = iVar17 < auVar45._0_4_;
                            iVar50 = SUB164(auVar49 ^ auVar62,4);
                            iVar27 = auVar45._4_4_;
                            if ((bool)(~(iVar50 < iVar27 || iVar27 == iVar50 && bVar44) & 1)) {
                              puVar20[-0x21] = 0x40000000;
                            }
                            if (iVar50 >= iVar27 && (iVar27 != iVar50 || !bVar44)) {
                              puVar20[-0x16] = 0x40000000;
                            }
                            auVar45 = (auVar56 | auVar60) ^ auVar62;
                            iVar27 = auVar45._4_4_;
                            if (iVar27 <= iVar50 && (iVar27 != iVar50 || auVar45._0_4_ <= iVar17)) {
                              puVar20[-0xb] = 0x40000000;
                              *puVar20 = 0x40000000;
                            }
                            uVar41 = uVar41 + 4;
                            puVar20 = puVar20 + 0x2c;
                          } while ((((uVar12 + uVar33) - local_190) + 3 & 0xfffffffffffffffc) !=
                                   uVar41);
                          local_190 = (ulong)uVar32;
                        }
                        uVar29 = uVar14 + (int)local_108 + uVar25 +
                                 (uint)lzma_rc_prices[(ulong)(uVar8 >> 4) ^ 0x7f] +
                                 (uint)lzma_rc_prices[(ulong)(uVar7 >> 4) ^ 0x7f] +
                                 local_c8[uVar29][(uVar33 - local_160) - 3] +
                                 (uint)lzma_rc_prices
                                       [(ulong)(coder->is_rep0_long[4][uVar29] >> 4) ^ 0x7f] +
                                 (uint)lzma_rc_prices[coder->is_rep0[4] >> 4];
                        if (uVar29 < coder->opts[uVar36].price) {
                          coder->opts[uVar36].price = uVar29;
                          coder->opts[uVar36].pos_prev = uVar13;
                          coder->opts[uVar36].back_prev = 0;
                          coder->opts[uVar36].prev_1_is_literal = true;
                          coder->opts[uVar36].prev_2 = true;
                          coder->opts[uVar36].pos_prev_2 = uVar12;
                          coder->opts[uVar36].back_prev_2 = uVar43 + 4;
                        }
                      }
                      uVar43 = (int)uVar24 + 1;
                      uVar24 = (ulong)uVar43;
                      local_160 = uVar31;
                    } while (uVar43 != uVar40);
                  }
                }
                lVar35 = lVar35 + 1;
                local_dc = local_dc - 1;
                local_d4 = local_d4 - 1;
                local_d8 = local_d8 + -1;
                uVar24 = local_80;
              } while (local_80 < local_190);
              coder->opts_end_index = (uint32_t)local_80;
              uVar37 = coder->opts[local_80 & 0xffffffff].pos_prev;
              uVar12 = coder->opts[local_80 & 0xffffffff].back_prev;
              do {
                uVar36 = (ulong)uVar37;
                uVar24 = local_80 & 0xffffffff;
                if (coder->opts[uVar24].prev_1_is_literal == false) {
                  uVar43 = coder->opts[uVar36].pos_prev;
                  uVar25 = coder->opts[uVar36].back_prev;
                }
                else {
                  coder->opts[uVar36].prev_1_is_literal = false;
                  uVar43 = uVar37 - 1;
                  uVar25 = 0xffffffff;
                  if (coder->opts[uVar24].prev_2 == true) {
                    coder->opts[uVar43].prev_1_is_literal = false;
                    uVar13 = coder->opts[uVar24].back_prev_2;
                    coder->opts[uVar43].pos_prev = coder->opts[uVar24].pos_prev_2;
                    coder->opts[uVar43].back_prev = uVar13;
                  }
                }
                coder->opts[uVar36].back_prev = uVar12;
                coder->opts[uVar36].pos_prev = (uint32_t)local_80;
                bVar44 = uVar37 != 0;
                local_80 = uVar36;
                uVar37 = uVar43;
                uVar12 = uVar25;
              } while (bVar44);
              uVar37 = coder->opts[0].pos_prev;
              coder->opts_current_index = uVar37;
              *local_118 = uVar37;
              *local_120 = coder->opts[0].back_prev;
              return;
            }
            *local_120 = uVar25;
          }
          *local_118 = 1;
        }
        else {
          *local_120 = coder->matches[local_124 - 1].dist + 4;
          *local_118 = uVar43;
          uVar12 = uVar43 - 1;
          if (uVar12 != 0) {
            (*local_100->skip)(local_100,uVar12);
            puVar20 = &plVar11->read_ahead;
            *puVar20 = *puVar20 + uVar12;
          }
        }
      }
      else {
        *local_120 = uVar40;
        *local_118 = uVar26;
        uVar12 = uVar26 - 1;
        if (uVar12 != 0) {
          (*local_100->skip)(local_100,uVar12);
          puVar20 = &plVar11->read_ahead;
          *puVar20 = *puVar20 + uVar12;
        }
      }
    }
  }
  else {
    if (uVar12 == 0) {
      __assert_fail("mf->read_ahead > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder_optimum_normal.c"
                    ,0x32b,
                    "void lzma_lzma_optimum_normal(lzma_lzma1_encoder *restrict, lzma_mf *restrict, uint32_t *restrict, uint32_t *restrict, uint32_t)"
                   );
    }
    uVar12 = coder->opts[uVar37].pos_prev;
    uVar25 = coder->opts[uVar37].back_prev;
    coder->opts_current_index = uVar12;
    *len_res = uVar12 - uVar37;
    *back_res = uVar25;
  }
  return;
code_r0x006a3ea1:
  uVar36 = uVar36 + 8;
  if (uVar26 <= uVar36) goto LAB_006a3ecc;
  goto LAB_006a3e95;
code_r0x006a4957:
  uVar31 = uVar31 + 8;
  if (uVar43 <= uVar31) goto LAB_006a4999;
  goto LAB_006a494b;
code_r0x006a4c76:
  uVar29 = uVar29 + 8;
  uVar36 = uVar24;
  if (uVar43 <= uVar29) goto LAB_006a4c8f;
  goto LAB_006a4c6a;
code_r0x006a4eba:
  uVar33 = uVar33 + 8;
  uVar32 = uVar31;
  if (uVar31 <= uVar33) goto LAB_006a4eec;
  goto LAB_006a4ead;
code_r0x006a5559:
  uVar32 = uVar32 + 8;
  uVar33 = uVar29;
  if (uVar29 <= uVar32) goto LAB_006a5572;
  goto LAB_006a554d;
}

Assistant:

extern void
lzma_lzma_optimum_normal(lzma_lzma1_encoder *restrict coder,
		lzma_mf *restrict mf,
		uint32_t *restrict back_res, uint32_t *restrict len_res,
		uint32_t position)
{
	// If we have symbols pending, return the next pending symbol.
	if (coder->opts_end_index != coder->opts_current_index) {
		assert(mf->read_ahead > 0);
		*len_res = coder->opts[coder->opts_current_index].pos_prev
				- coder->opts_current_index;
		*back_res = coder->opts[coder->opts_current_index].back_prev;
		coder->opts_current_index = coder->opts[
				coder->opts_current_index].pos_prev;
		return;
	}

	// Update the price tables. In LZMA SDK <= 4.60 (and possibly later)
	// this was done in both initialization function and in the main loop.
	// In liblzma they were moved into this single place.
	if (mf->read_ahead == 0) {
		if (coder->match_price_count >= (1 << 7))
			fill_dist_prices(coder);

		if (coder->align_price_count >= ALIGN_SIZE)
			fill_align_prices(coder);
	}

	// TODO: This needs quite a bit of cleaning still. But splitting
	// the original function into two pieces makes it at least a little
	// more readable, since those two parts don't share many variables.

	uint32_t len_end = helper1(coder, mf, back_res, len_res, position);
	if (len_end == UINT32_MAX)
		return;

	uint32_t reps[REPS];
	memcpy(reps, coder->reps, sizeof(reps));

	uint32_t cur;
	for (cur = 1; cur < len_end; ++cur) {
		assert(cur < OPTS);

		coder->longest_match_length = mf_find(
				mf, &coder->matches_count, coder->matches);

		if (coder->longest_match_length >= mf->nice_len)
			break;

		len_end = helper2(coder, reps, mf_ptr(mf) - 1, len_end,
				position + cur, cur, mf->nice_len,
				my_min(mf_avail(mf) + 1, OPTS - 1 - cur));
	}

	backward(coder, len_res, back_res, cur);
	return;
}